

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall TypeTest_TestTypeRelations_Test::TestBody(TypeTest_TestTypeRelations_Test *this)

{
  bool bVar1;
  Entry *this_00;
  char *message;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar2;
  const_reference pvVar3;
  char *in_R9;
  optional<wasm::HeapType> other;
  Entry EVar4;
  Type local_11c0;
  Type local_11b8;
  Type local_11b0;
  uintptr_t local_11a8;
  Type local_11a0;
  Type local_1198;
  Type local_1190;
  uintptr_t local_1188;
  Type local_1180;
  Type local_1178;
  Type local_1170;
  uintptr_t local_1168;
  uintptr_t local_1160;
  uintptr_t local_1158;
  uintptr_t local_1150;
  uintptr_t local_1148;
  uintptr_t local_1140;
  uintptr_t local_1138;
  uintptr_t local_1130;
  uintptr_t local_1128;
  Type local_1120;
  Type local_1118;
  Type local_1110;
  uintptr_t local_1108;
  Type local_1100;
  Type local_10f8;
  Type local_10f0;
  uintptr_t local_10e8;
  Type local_10e0;
  Type local_10d8;
  Type local_10d0;
  uintptr_t local_10c8;
  uintptr_t local_10c0;
  uintptr_t local_10b8;
  uintptr_t local_10b0;
  uintptr_t local_10a8;
  uintptr_t local_10a0;
  uintptr_t local_1098;
  uintptr_t local_1090;
  uintptr_t local_1088;
  uintptr_t local_1080;
  uintptr_t local_1078;
  uintptr_t local_1070;
  uintptr_t local_1068;
  Type local_1060;
  Type local_1058;
  Type local_1050;
  uintptr_t local_1048;
  Type local_1040;
  Type local_1038;
  Type local_1030;
  uintptr_t local_1028;
  Type local_1020;
  Type local_1018;
  Type local_1010;
  uintptr_t local_1008;
  uintptr_t local_1000;
  uintptr_t local_ff8;
  uintptr_t local_ff0;
  uintptr_t local_fe8;
  uintptr_t local_fe0;
  uintptr_t local_fd8;
  uintptr_t local_fd0;
  uintptr_t local_fc8;
  uintptr_t local_fc0;
  uintptr_t local_fb8;
  uintptr_t local_fb0;
  uintptr_t local_fa8;
  uintptr_t local_fa0;
  uintptr_t local_f98;
  uintptr_t local_f90;
  uintptr_t local_f88;
  Type local_f80;
  Type local_f78;
  Type local_f70;
  uintptr_t local_f68;
  Type local_f60;
  Type local_f58;
  Type local_f50;
  uintptr_t local_f48;
  Type local_f40;
  Type local_f38;
  Type local_f30;
  uintptr_t local_f28;
  uintptr_t local_f20;
  uintptr_t local_f18;
  uintptr_t local_f10;
  uintptr_t local_f08;
  uintptr_t local_f00;
  uintptr_t local_ef8;
  uintptr_t local_ef0;
  uintptr_t local_ee8;
  uintptr_t local_ee0;
  uintptr_t local_ed8;
  uintptr_t local_ed0;
  uintptr_t local_ec8;
  uintptr_t local_ec0;
  uintptr_t local_eb8;
  uintptr_t local_eb0;
  uintptr_t local_ea8;
  uintptr_t local_ea0;
  uintptr_t local_e98;
  uintptr_t local_e90;
  uintptr_t local_e88;
  Type local_e80;
  Type local_e78;
  Type local_e70;
  uintptr_t local_e68;
  Type local_e60;
  Type local_e58;
  Type local_e50;
  uintptr_t local_e48;
  Type local_e40;
  Type local_e38;
  Type local_e30;
  uintptr_t local_e28;
  uintptr_t local_e20;
  uintptr_t local_e18;
  uintptr_t local_e10;
  uintptr_t local_e08;
  uintptr_t local_e00;
  uintptr_t local_df8;
  uintptr_t local_df0;
  uintptr_t local_de8;
  uintptr_t local_de0;
  uintptr_t local_dd8;
  uintptr_t local_dd0;
  uintptr_t local_dc8;
  uintptr_t local_dc0;
  uintptr_t local_db8;
  uintptr_t local_db0;
  uintptr_t local_da8;
  uintptr_t local_da0;
  uintptr_t local_d98;
  uintptr_t local_d90;
  uintptr_t local_d88;
  uintptr_t local_d80;
  uintptr_t local_d78;
  uintptr_t local_d70;
  uintptr_t local_d68;
  Type local_d60;
  Type local_d58;
  Type local_d50;
  uintptr_t local_d48;
  Type local_d40;
  Type local_d38;
  Type local_d30;
  uintptr_t local_d28;
  Type local_d20;
  Type local_d18;
  Type local_d10;
  uintptr_t local_d08;
  uintptr_t local_d00;
  uintptr_t local_cf8;
  uintptr_t local_cf0;
  uintptr_t local_ce8;
  uintptr_t local_ce0;
  uintptr_t local_cd8;
  uintptr_t local_cd0;
  uintptr_t local_cc8;
  uintptr_t local_cc0;
  uintptr_t local_cb8;
  uintptr_t local_cb0;
  uintptr_t local_ca8;
  uintptr_t local_ca0;
  uintptr_t local_c98;
  uintptr_t local_c90;
  uintptr_t local_c88;
  uintptr_t local_c80;
  uintptr_t local_c78;
  uintptr_t local_c70;
  uintptr_t local_c68;
  uintptr_t local_c60;
  uintptr_t local_c58;
  uintptr_t local_c50;
  uintptr_t local_c48;
  uintptr_t local_c40;
  uintptr_t local_c38;
  uintptr_t local_c30;
  uintptr_t local_c28;
  Type local_c20;
  Type local_c18;
  Type local_c10;
  uintptr_t local_c08;
  Type local_c00;
  Type local_bf8;
  Type local_bf0;
  uintptr_t local_be8;
  Type local_be0;
  Type local_bd8;
  Type local_bd0;
  uintptr_t local_bc8;
  uintptr_t local_bc0;
  uintptr_t local_bb8;
  uintptr_t local_bb0;
  uintptr_t local_ba8;
  uintptr_t local_ba0;
  uintptr_t local_b98;
  uintptr_t local_b90;
  uintptr_t local_b88;
  uintptr_t local_b80;
  uintptr_t local_b78;
  uintptr_t local_b70;
  uintptr_t local_b68;
  uintptr_t local_b60;
  uintptr_t local_b58;
  uintptr_t local_b50;
  uintptr_t local_b48;
  uintptr_t local_b40;
  uintptr_t local_b38;
  uintptr_t local_b30;
  uintptr_t local_b28;
  uintptr_t local_b20;
  uintptr_t local_b18;
  uintptr_t local_b10;
  uintptr_t local_b08;
  uintptr_t local_b00;
  uintptr_t local_af8;
  uintptr_t local_af0;
  uintptr_t local_ae8;
  uintptr_t local_ae0;
  uintptr_t local_ad8;
  uintptr_t local_ad0;
  uintptr_t local_ac8;
  Type local_ac0;
  Type local_ab8;
  Type local_ab0;
  uintptr_t local_aa8;
  Type local_aa0;
  Type local_a98;
  Type local_a90;
  uintptr_t local_a88;
  Type local_a80;
  Type local_a78;
  Type local_a70;
  uintptr_t local_a68;
  uintptr_t local_a60;
  uintptr_t local_a58;
  uintptr_t local_a50;
  uintptr_t local_a48;
  uintptr_t local_a40;
  uintptr_t local_a38;
  uintptr_t local_a30;
  uintptr_t local_a28;
  uintptr_t local_a20;
  uintptr_t local_a18;
  uintptr_t local_a10;
  uintptr_t local_a08;
  uintptr_t local_a00;
  uintptr_t local_9f8;
  uintptr_t local_9f0;
  uintptr_t local_9e8;
  uintptr_t local_9e0;
  uintptr_t local_9d8;
  uintptr_t local_9d0;
  uintptr_t local_9c8;
  uintptr_t local_9c0;
  uintptr_t local_9b8;
  uintptr_t local_9b0;
  uintptr_t local_9a8;
  uintptr_t local_9a0;
  uintptr_t local_998;
  uintptr_t local_990;
  uintptr_t local_988;
  uintptr_t local_980;
  uintptr_t local_978;
  uintptr_t local_970;
  uintptr_t local_968;
  uintptr_t local_960;
  uintptr_t local_958;
  uintptr_t local_950;
  uintptr_t local_948;
  Type local_940;
  Type local_938;
  Type local_930;
  uintptr_t local_928;
  Type local_920;
  Type local_918;
  Type local_910;
  uintptr_t local_908;
  Type local_900;
  Type local_8f8;
  Type local_8f0;
  uintptr_t local_8e8;
  uintptr_t local_8e0;
  uintptr_t local_8d8;
  uintptr_t local_8d0;
  uintptr_t local_8c8;
  uintptr_t local_8c0;
  uintptr_t local_8b8;
  uintptr_t local_8b0;
  uintptr_t local_8a8;
  uintptr_t local_8a0;
  uintptr_t local_898;
  uintptr_t local_890;
  uintptr_t local_888;
  uintptr_t local_880;
  uintptr_t local_878;
  uintptr_t local_870;
  uintptr_t local_868;
  uintptr_t local_860;
  uintptr_t local_858;
  uintptr_t local_850;
  uintptr_t local_848;
  uintptr_t local_840;
  uintptr_t local_838;
  uintptr_t local_830;
  uintptr_t local_828;
  uintptr_t local_820;
  uintptr_t local_818;
  uintptr_t local_810;
  uintptr_t local_808;
  uintptr_t local_800;
  uintptr_t local_7f8;
  uintptr_t local_7f0;
  uintptr_t local_7e8;
  uintptr_t local_7e0;
  uintptr_t local_7d8;
  uintptr_t local_7d0;
  uintptr_t local_7c8;
  uintptr_t local_7c0;
  uintptr_t local_7b8;
  uintptr_t local_7b0;
  uintptr_t local_7a8;
  Type local_7a0;
  Type local_798;
  Type local_790;
  uintptr_t local_788;
  Type local_780;
  Type local_778;
  Type local_770;
  uintptr_t local_768;
  Type local_760;
  Type local_758;
  Type local_750;
  uintptr_t local_748;
  uintptr_t local_740;
  uintptr_t local_738;
  uintptr_t local_730;
  uintptr_t local_728;
  uintptr_t local_720;
  uintptr_t local_718;
  uintptr_t local_710;
  uintptr_t local_708;
  uintptr_t local_700;
  uintptr_t local_6f8;
  uintptr_t local_6f0;
  uintptr_t local_6e8;
  uintptr_t local_6e0;
  uintptr_t local_6d8;
  uintptr_t local_6d0;
  uintptr_t local_6c8;
  uintptr_t local_6c0;
  uintptr_t local_6b8;
  uintptr_t local_6b0;
  uintptr_t local_6a8;
  uintptr_t local_6a0;
  uintptr_t local_698;
  uintptr_t local_690;
  uintptr_t local_688;
  uintptr_t local_680;
  uintptr_t local_678;
  uintptr_t local_670;
  uintptr_t local_668;
  uintptr_t local_660;
  uintptr_t local_658;
  uintptr_t local_650;
  uintptr_t local_648;
  uintptr_t local_640;
  uintptr_t local_638;
  uintptr_t local_630;
  uintptr_t local_628;
  uintptr_t local_620;
  uintptr_t local_618;
  uintptr_t local_610;
  uintptr_t local_608;
  uintptr_t local_600;
  uintptr_t local_5f8;
  uintptr_t local_5f0;
  uintptr_t local_5e8;
  Type local_5e0;
  Type local_5d8;
  Type local_5d0;
  uintptr_t local_5c8;
  Type local_5c0;
  Type local_5b8;
  Type local_5b0;
  uintptr_t local_5a8;
  Type local_5a0;
  Type local_598;
  Type local_590;
  uintptr_t local_588;
  uintptr_t local_580;
  uintptr_t local_578;
  uintptr_t local_570;
  uintptr_t local_568;
  uintptr_t local_560;
  uintptr_t local_558;
  uintptr_t local_550;
  uintptr_t local_548;
  uintptr_t local_540;
  uintptr_t local_538;
  uintptr_t local_530;
  uintptr_t local_528;
  uintptr_t local_520;
  uintptr_t local_518;
  uintptr_t local_510;
  uintptr_t local_508;
  uintptr_t local_500;
  uintptr_t local_4f8;
  uintptr_t local_4f0;
  uintptr_t local_4e8;
  uintptr_t local_4e0;
  uintptr_t local_4d8;
  uintptr_t local_4d0;
  uintptr_t local_4c8;
  uintptr_t local_4c0;
  uintptr_t local_4b8;
  uintptr_t local_4b0;
  uintptr_t local_4a8;
  uintptr_t local_4a0;
  uintptr_t local_498;
  uintptr_t local_490;
  uintptr_t local_488;
  uintptr_t local_480;
  uintptr_t local_478;
  uintptr_t local_470;
  uintptr_t local_468;
  uintptr_t local_460;
  uintptr_t local_458;
  uintptr_t local_450;
  uintptr_t local_448;
  uintptr_t local_440;
  uintptr_t local_438;
  uintptr_t local_430;
  uintptr_t local_428;
  uintptr_t local_420;
  uintptr_t local_418;
  uintptr_t local_410;
  uintptr_t local_408;
  Type local_400;
  Type local_3f8;
  Type local_3f0;
  uintptr_t local_3e8;
  Type local_3e0;
  Type local_3d8;
  Type local_3d0;
  uintptr_t local_3c8;
  Type local_3c0;
  Type local_3b8;
  Type local_3b0;
  uintptr_t local_3a8;
  uintptr_t local_3a0;
  uintptr_t local_398;
  uintptr_t local_390;
  uintptr_t local_388;
  uintptr_t local_380;
  uintptr_t local_378;
  uintptr_t local_370;
  uintptr_t local_368;
  uintptr_t local_360;
  uintptr_t local_358;
  uintptr_t local_350;
  uintptr_t local_348;
  uintptr_t local_340;
  uintptr_t local_338;
  uintptr_t local_330;
  uintptr_t local_328;
  uintptr_t local_320;
  uintptr_t local_318;
  uintptr_t local_310;
  uintptr_t local_308;
  uintptr_t local_300;
  uintptr_t local_2f8;
  uintptr_t local_2f0;
  uintptr_t local_2e8;
  uintptr_t local_2e0;
  uintptr_t local_2d8;
  uintptr_t local_2d0;
  uintptr_t local_2c8;
  uintptr_t local_2c0;
  uintptr_t local_2b8;
  uintptr_t local_2b0;
  uintptr_t local_2a8;
  uintptr_t local_2a0;
  uintptr_t local_298;
  uintptr_t local_290;
  uintptr_t local_288;
  uintptr_t local_280;
  uintptr_t local_278;
  uintptr_t local_270;
  uintptr_t local_268;
  uintptr_t local_260;
  uintptr_t local_258;
  uintptr_t local_250;
  uintptr_t local_248;
  uintptr_t local_240;
  uintptr_t local_238;
  uintptr_t local_230;
  anon_class_1_0_00000001 local_221;
  Type TStack_220;
  anon_class_1_0_00000001 assertLUB;
  Type unreachable;
  Type i32;
  Type local_208;
  Type nullFunc;
  Type local_1f8;
  Type func;
  Type local_1e8;
  Type nullNone;
  Type local_1d8;
  Type none;
  Type local_1c8;
  Type nullExactSub;
  Type local_1b8;
  Type exactSub;
  Type local_1a8;
  Type nullSub;
  Type local_198;
  Type sub;
  Type local_188;
  Type nullExactSup;
  Type local_178;
  Type exactSup;
  Type local_168;
  Type nullSup;
  Type local_158;
  Type sup;
  Type local_148;
  Type nullAny;
  Type local_138;
  Type any;
  string local_128;
  AssertHelper local_108;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_;
  BuildResult built;
  undefined1 local_b8 [12];
  Entry local_a8;
  Entry local_98;
  Struct local_88 [2];
  Entry local_58;
  Struct local_48;
  TypeBuilder local_28;
  TypeBuilder builder;
  HeapType definedSub;
  HeapType definedSuper;
  TypeTest_TestTypeRelations_Test *this_local;
  
  ::wasm::HeapType::HeapType(&definedSub);
  ::wasm::HeapType::HeapType((HeapType *)&builder);
  ::wasm::TypeBuilder::TypeBuilder(&local_28,2);
  local_48.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(&local_48);
  local_58 = ::wasm::TypeBuilder::operator[](&local_28,0);
  this_00 = ::wasm::TypeBuilder::Entry::setOpen(&local_58,true);
  ::wasm::TypeBuilder::Entry::operator=(this_00,&local_48);
  ::wasm::Struct::~Struct(&local_48);
  local_88[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(local_88);
  local_98 = ::wasm::TypeBuilder::operator[](&local_28,1);
  ::wasm::TypeBuilder::Entry::operator=(&local_98,local_88);
  ::wasm::Struct::~Struct(local_88);
  local_a8 = ::wasm::TypeBuilder::operator[](&local_28,1);
  EVar4 = ::wasm::TypeBuilder::operator[](&local_28,0);
  built.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar4.builder;
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_b8,
             (Entry *)((long)&built.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18));
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_b8._0_8_;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_b8[8];
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_b8._9_3_;
  ::wasm::TypeBuilder::Entry::subTypeOf(&local_a8,other);
  ::wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_f8,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_f8,(AssertionResult *)"built","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x4bb,message);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    testing::Message::~Message(&local_100);
  }
  any.id._5_3_ = 0;
  any.id._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  if (any.id._4_4_ == 0) {
    pvVar2 = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[](pvVar2,0);
    definedSub.id = pvVar3->id;
    pvVar2 = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[](pvVar2,1);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         pvVar3->id;
    any.id._4_4_ = 0;
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder(&local_28);
  if (any.id._4_4_ == 0) {
    ::wasm::HeapType::HeapType((HeapType *)&nullAny,any);
    ::wasm::Type::Type(&local_138,(HeapType)nullAny.id,NonNullable,Inexact);
    ::wasm::HeapType::HeapType((HeapType *)&sup,any);
    ::wasm::Type::Type(&local_148,(HeapType)sup.id,Nullable,Inexact);
    nullSup.id = definedSub.id;
    ::wasm::Type::Type(&local_158,definedSub,NonNullable,Inexact);
    exactSup.id = definedSub.id;
    ::wasm::Type::Type(&local_168,definedSub,Nullable,Inexact);
    nullExactSup.id = definedSub.id;
    ::wasm::Type::Type(&local_178,definedSub,NonNullable,Exact);
    sub.id = definedSub.id;
    ::wasm::Type::Type(&local_188,definedSub,Nullable,Exact);
    nullSub.id = (uintptr_t)
                 builder.impl._M_t.
                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    ::wasm::Type::Type(&local_198,
                       (HeapType)
                       builder.impl._M_t.
                       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                       NonNullable,Inexact);
    exactSub.id = (uintptr_t)
                  builder.impl._M_t.
                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                  .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    ::wasm::Type::Type(&local_1a8,
                       (HeapType)
                       builder.impl._M_t.
                       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                       Nullable,Inexact);
    nullExactSub.id =
         (uintptr_t)
         builder.impl._M_t.
         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    ::wasm::Type::Type(&local_1b8,
                       (HeapType)
                       builder.impl._M_t.
                       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                       NonNullable,Exact);
    none.id = (uintptr_t)
              builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    ::wasm::Type::Type(&local_1c8,
                       (HeapType)
                       builder.impl._M_t.
                       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                       Nullable,Exact);
    ::wasm::HeapType::HeapType((HeapType *)&nullNone,none);
    ::wasm::Type::Type(&local_1d8,(HeapType)nullNone.id,NonNullable,Inexact);
    ::wasm::HeapType::HeapType((HeapType *)&func,none);
    ::wasm::Type::Type(&local_1e8,(HeapType)func.id,Nullable,Inexact);
    ::wasm::HeapType::HeapType((HeapType *)&nullFunc,func);
    ::wasm::Type::Type(&local_1f8,(HeapType)nullFunc.id,NonNullable,Inexact);
    ::wasm::HeapType::HeapType((HeapType *)&i32,func);
    ::wasm::Type::Type(&local_208,(HeapType)i32.id,Nullable,Inexact);
    ::wasm::Type::Type(&unreachable,i32);
    ::wasm::Type::Type(&stack0xfffffffffffffde0,unreachable);
    local_230 = local_138.id;
    local_238 = local_138.id;
    local_240 = local_138.id;
    local_248 = local_138.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,local_138,local_138,local_138);
    local_250 = local_138.id;
    local_258 = local_148.id;
    local_260 = local_148.id;
    local_268 = local_138.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,local_148,local_148,local_138);
    local_270 = local_138.id;
    local_278 = local_158.id;
    local_280 = local_138.id;
    local_288 = local_158.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,local_158,local_138,local_158);
    local_290 = local_138.id;
    local_298 = local_168.id;
    local_2a0 = local_148.id;
    local_2a8 = local_158.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,local_168,local_148,local_158);
    local_2b0 = local_138.id;
    local_2b8 = local_178.id;
    local_2c0 = local_138.id;
    local_2c8 = local_178.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,local_178,local_138,local_178);
    local_2d0 = local_138.id;
    local_2d8 = local_188.id;
    local_2e0 = local_148.id;
    local_2e8 = local_178.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,local_188,local_148,local_178);
    local_2f0 = local_138.id;
    local_2f8 = local_198.id;
    local_300 = local_138.id;
    local_308 = local_198.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,local_198,local_138,local_198);
    local_310 = local_138.id;
    local_318 = local_1a8.id;
    local_320 = local_148.id;
    local_328 = local_198.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,local_1a8,local_148,local_198);
    local_330 = local_138.id;
    local_338 = local_1b8.id;
    local_340 = local_138.id;
    local_348 = local_1b8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,local_1b8,local_138,local_1b8);
    local_350 = local_138.id;
    local_358 = local_1c8.id;
    local_360 = local_148.id;
    local_368 = local_1b8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,local_1c8,local_148,local_1b8);
    local_370 = local_138.id;
    local_378 = local_1d8.id;
    local_380 = local_138.id;
    local_388 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,local_1d8,local_138,local_1d8);
    local_390 = local_138.id;
    local_398 = local_1e8.id;
    local_3a0 = local_148.id;
    local_3a8 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,local_1e8,local_148,local_1d8);
    local_3b0.id = local_138.id;
    local_3b8.id = local_1f8.id;
    ::wasm::Type::Type(&local_3c0,none);
    local_3c8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_3b0,local_3b8,local_3c0,TStack_220);
    local_3d0.id = local_138.id;
    local_3d8.id = local_208.id;
    ::wasm::Type::Type(&local_3e0,none);
    local_3e8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_3d0,local_3d8,local_3e0,TStack_220);
    local_3f0.id = local_138.id;
    local_3f8.id = unreachable.id;
    ::wasm::Type::Type(&local_400,none);
    local_408 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_3f0,local_3f8,local_400,TStack_220);
    local_410 = local_138.id;
    local_418 = TStack_220.id;
    local_420 = local_138.id;
    local_428 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_138,TStack_220,local_138,TStack_220);
    local_430 = local_148.id;
    local_438 = local_148.id;
    local_440 = local_148.id;
    local_448 = local_148.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_148,local_148,local_148,local_148);
    local_450 = local_148.id;
    local_458 = local_158.id;
    local_460 = local_148.id;
    local_468 = local_158.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_148,local_158,local_148,local_158);
    local_470 = local_148.id;
    local_478 = local_168.id;
    local_480 = local_148.id;
    local_488 = local_168.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_148,local_168,local_148,local_168);
    local_490 = local_148.id;
    local_498 = local_178.id;
    local_4a0 = local_148.id;
    local_4a8 = local_178.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_148,local_178,local_148,local_178);
    local_4b0 = local_148.id;
    local_4b8 = local_188.id;
    local_4c0 = local_148.id;
    local_4c8 = local_188.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_148,local_188,local_148,local_188);
    local_4d0 = local_148.id;
    local_4d8 = local_198.id;
    local_4e0 = local_148.id;
    local_4e8 = local_198.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_148,local_198,local_148,local_198);
    local_4f0 = local_148.id;
    local_4f8 = local_1a8.id;
    local_500 = local_148.id;
    local_508 = local_1a8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_148,local_1a8,local_148,local_1a8);
    local_510 = local_148.id;
    local_518 = local_1b8.id;
    local_520 = local_148.id;
    local_528 = local_1b8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_148,local_1b8,local_148,local_1b8);
    local_530 = local_148.id;
    local_538 = local_1c8.id;
    local_540 = local_148.id;
    local_548 = local_1c8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_148,local_1c8,local_148,local_1c8);
    local_550 = local_148.id;
    local_558 = local_1d8.id;
    local_560 = local_148.id;
    local_568 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_148,local_1d8,local_148,local_1d8);
    local_570 = local_148.id;
    local_578 = local_1e8.id;
    local_580 = local_148.id;
    local_588 = local_1e8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_148,local_1e8,local_148,local_1e8);
    local_590.id = local_148.id;
    local_598.id = local_1f8.id;
    ::wasm::Type::Type(&local_5a0,none);
    local_5a8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_590,local_598,local_5a0,TStack_220);
    local_5b0.id = local_148.id;
    local_5b8.id = local_208.id;
    ::wasm::Type::Type(&local_5c0,none);
    local_5c8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_5b0,local_5b8,local_5c0,TStack_220);
    local_5d0.id = local_148.id;
    local_5d8.id = unreachable.id;
    ::wasm::Type::Type(&local_5e0,none);
    local_5e8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_5d0,local_5d8,local_5e0,TStack_220);
    local_5f0 = local_148.id;
    local_5f8 = TStack_220.id;
    local_600 = local_148.id;
    local_608 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_148,TStack_220,local_148,TStack_220);
    local_610 = local_158.id;
    local_618 = local_158.id;
    local_620 = local_158.id;
    local_628 = local_158.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_158,local_158,local_158,local_158);
    local_630 = local_158.id;
    local_638 = local_168.id;
    local_640 = local_168.id;
    local_648 = local_158.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_158,local_168,local_168,local_158);
    local_650 = local_158.id;
    local_658 = local_178.id;
    local_660 = local_158.id;
    local_668 = local_178.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_158,local_178,local_158,local_178);
    local_670 = local_158.id;
    local_678 = local_188.id;
    local_680 = local_168.id;
    local_688 = local_178.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_158,local_188,local_168,local_178);
    local_690 = local_158.id;
    local_698 = local_198.id;
    local_6a0 = local_158.id;
    local_6a8 = local_198.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_158,local_198,local_158,local_198);
    local_6b0 = local_158.id;
    local_6b8 = local_1a8.id;
    local_6c0 = local_168.id;
    local_6c8 = local_198.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_158,local_1a8,local_168,local_198);
    local_6d0 = local_158.id;
    local_6d8 = local_1b8.id;
    local_6e0 = local_158.id;
    local_6e8 = local_1b8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_158,local_1b8,local_158,local_1b8);
    local_6f0 = local_158.id;
    local_6f8 = local_1c8.id;
    local_700 = local_168.id;
    local_708 = local_1b8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_158,local_1c8,local_168,local_1b8);
    local_710 = local_158.id;
    local_718 = local_1d8.id;
    local_720 = local_158.id;
    local_728 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_158,local_1d8,local_158,local_1d8);
    local_730 = local_158.id;
    local_738 = local_1e8.id;
    local_740 = local_168.id;
    local_748 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_158,local_1e8,local_168,local_1d8);
    local_750.id = local_158.id;
    local_758.id = local_1f8.id;
    ::wasm::Type::Type(&local_760,none);
    local_768 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_750,local_758,local_760,TStack_220);
    local_770.id = local_158.id;
    local_778.id = local_208.id;
    ::wasm::Type::Type(&local_780,none);
    local_788 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_770,local_778,local_780,TStack_220);
    local_790.id = local_158.id;
    local_798.id = unreachable.id;
    ::wasm::Type::Type(&local_7a0,none);
    local_7a8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_790,local_798,local_7a0,TStack_220);
    local_7b0 = local_158.id;
    local_7b8 = TStack_220.id;
    local_7c0 = local_158.id;
    local_7c8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_158,TStack_220,local_158,TStack_220);
    local_7d0 = local_168.id;
    local_7d8 = local_168.id;
    local_7e0 = local_168.id;
    local_7e8 = local_168.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_168,local_168,local_168,local_168);
    local_7f0 = local_168.id;
    local_7f8 = local_178.id;
    local_800 = local_168.id;
    local_808 = local_178.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_168,local_178,local_168,local_178);
    local_810 = local_168.id;
    local_818 = local_188.id;
    local_820 = local_168.id;
    local_828 = local_188.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_168,local_188,local_168,local_188);
    local_830 = local_168.id;
    local_838 = local_198.id;
    local_840 = local_168.id;
    local_848 = local_198.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_168,local_198,local_168,local_198);
    local_850 = local_168.id;
    local_858 = local_1a8.id;
    local_860 = local_168.id;
    local_868 = local_1a8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_168,local_1a8,local_168,local_1a8);
    local_870 = local_168.id;
    local_878 = local_1b8.id;
    local_880 = local_168.id;
    local_888 = local_1b8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_168,local_1b8,local_168,local_1b8);
    local_890 = local_168.id;
    local_898 = local_1c8.id;
    local_8a0 = local_168.id;
    local_8a8 = local_1c8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_168,local_1c8,local_168,local_1c8);
    local_8b0 = local_168.id;
    local_8b8 = local_1d8.id;
    local_8c0 = local_168.id;
    local_8c8 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_168,local_1d8,local_168,local_1d8);
    local_8d0 = local_168.id;
    local_8d8 = local_1e8.id;
    local_8e0 = local_168.id;
    local_8e8 = local_1e8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_168,local_1e8,local_168,local_1e8);
    local_8f0.id = local_168.id;
    local_8f8.id = local_1f8.id;
    ::wasm::Type::Type(&local_900,none);
    local_908 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_8f0,local_8f8,local_900,TStack_220);
    local_910.id = local_168.id;
    local_918.id = local_208.id;
    ::wasm::Type::Type(&local_920,none);
    local_928 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_910,local_918,local_920,TStack_220);
    local_930.id = local_168.id;
    local_938.id = unreachable.id;
    ::wasm::Type::Type(&local_940,none);
    local_948 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_930,local_938,local_940,TStack_220);
    local_950 = local_168.id;
    local_958 = TStack_220.id;
    local_960 = local_168.id;
    local_968 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_168,TStack_220,local_168,TStack_220);
    local_970 = local_178.id;
    local_978 = local_178.id;
    local_980 = local_178.id;
    local_988 = local_178.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_178,local_178,local_178,local_178);
    local_990 = local_178.id;
    local_998 = local_188.id;
    local_9a0 = local_188.id;
    local_9a8 = local_178.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_178,local_188,local_188,local_178);
    local_9b0 = local_178.id;
    local_9b8 = local_198.id;
    local_9c0 = local_158.id;
    local_9c8 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_178,local_198,local_158,local_1d8);
    local_9d0 = local_178.id;
    local_9d8 = local_1a8.id;
    local_9e0 = local_168.id;
    local_9e8 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_178,local_1a8,local_168,local_1d8);
    local_9f0 = local_178.id;
    local_9f8 = local_1b8.id;
    local_a00 = local_158.id;
    local_a08 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_178,local_1b8,local_158,local_1d8);
    local_a10 = local_178.id;
    local_a18 = local_1c8.id;
    local_a20 = local_168.id;
    local_a28 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_178,local_1c8,local_168,local_1d8);
    local_a30 = local_178.id;
    local_a38 = local_1d8.id;
    local_a40 = local_178.id;
    local_a48 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_178,local_1d8,local_178,local_1d8);
    local_a50 = local_178.id;
    local_a58 = local_1e8.id;
    local_a60 = local_188.id;
    local_a68 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_178,local_1e8,local_188,local_1d8);
    local_a70.id = local_178.id;
    local_a78.id = local_1f8.id;
    ::wasm::Type::Type(&local_a80,none);
    local_a88 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_a70,local_a78,local_a80,TStack_220);
    local_a90.id = local_178.id;
    local_a98.id = local_208.id;
    ::wasm::Type::Type(&local_aa0,none);
    local_aa8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_a90,local_a98,local_aa0,TStack_220);
    local_ab0.id = local_178.id;
    local_ab8.id = unreachable.id;
    ::wasm::Type::Type(&local_ac0,none);
    local_ac8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_ab0,local_ab8,local_ac0,TStack_220);
    local_ad0 = local_178.id;
    local_ad8 = TStack_220.id;
    local_ae0 = local_178.id;
    local_ae8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_178,TStack_220,local_178,TStack_220);
    local_af0 = local_188.id;
    local_af8 = local_188.id;
    local_b00 = local_188.id;
    local_b08 = local_188.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_188,local_188,local_188,local_188);
    local_b10 = local_188.id;
    local_b18 = local_198.id;
    local_b20 = local_168.id;
    local_b28 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_188,local_198,local_168,local_1d8);
    local_b30 = local_188.id;
    local_b38 = local_1a8.id;
    local_b40 = local_168.id;
    local_b48 = local_1e8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_188,local_1a8,local_168,local_1e8);
    local_b50 = local_188.id;
    local_b58 = local_1b8.id;
    local_b60 = local_168.id;
    local_b68 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_188,local_1b8,local_168,local_1d8);
    local_b70 = local_188.id;
    local_b78 = local_1c8.id;
    local_b80 = local_168.id;
    local_b88 = local_1e8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_188,local_1c8,local_168,local_1e8);
    local_b90 = local_188.id;
    local_b98 = local_1d8.id;
    local_ba0 = local_188.id;
    local_ba8 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_188,local_1d8,local_188,local_1d8);
    local_bb0 = local_188.id;
    local_bb8 = local_1e8.id;
    local_bc0 = local_188.id;
    local_bc8 = local_1e8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_188,local_1e8,local_188,local_1e8);
    local_bd0.id = local_188.id;
    local_bd8.id = local_1f8.id;
    ::wasm::Type::Type(&local_be0,none);
    local_be8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_bd0,local_bd8,local_be0,TStack_220);
    local_bf0.id = local_188.id;
    local_bf8.id = local_208.id;
    ::wasm::Type::Type(&local_c00,none);
    local_c08 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_bf0,local_bf8,local_c00,TStack_220);
    local_c10.id = local_188.id;
    local_c18.id = unreachable.id;
    ::wasm::Type::Type(&local_c20,none);
    local_c28 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_c10,local_c18,local_c20,TStack_220);
    local_c30 = local_188.id;
    local_c38 = TStack_220.id;
    local_c40 = local_188.id;
    local_c48 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_188,TStack_220,local_188,TStack_220);
    local_c50 = local_198.id;
    local_c58 = local_198.id;
    local_c60 = local_198.id;
    local_c68 = local_198.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_198,local_198,local_198,local_198);
    local_c70 = local_198.id;
    local_c78 = local_1a8.id;
    local_c80 = local_1a8.id;
    local_c88 = local_198.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_198,local_1a8,local_1a8,local_198);
    local_c90 = local_198.id;
    local_c98 = local_1b8.id;
    local_ca0 = local_198.id;
    local_ca8 = local_1b8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_198,local_1b8,local_198,local_1b8);
    local_cb0 = local_198.id;
    local_cb8 = local_1c8.id;
    local_cc0 = local_1a8.id;
    local_cc8 = local_1b8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_198,local_1c8,local_1a8,local_1b8);
    local_cd0 = local_198.id;
    local_cd8 = local_1d8.id;
    local_ce0 = local_198.id;
    local_ce8 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_198,local_1d8,local_198,local_1d8);
    local_cf0 = local_198.id;
    local_cf8 = local_1e8.id;
    local_d00 = local_1a8.id;
    local_d08 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_198,local_1e8,local_1a8,local_1d8);
    local_d10.id = local_198.id;
    local_d18.id = local_1f8.id;
    ::wasm::Type::Type(&local_d20,none);
    local_d28 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_d10,local_d18,local_d20,TStack_220);
    local_d30.id = local_198.id;
    local_d38.id = local_208.id;
    ::wasm::Type::Type(&local_d40,none);
    local_d48 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_d30,local_d38,local_d40,TStack_220);
    local_d50.id = local_198.id;
    local_d58.id = unreachable.id;
    ::wasm::Type::Type(&local_d60,none);
    local_d68 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_d50,local_d58,local_d60,TStack_220);
    local_d70 = local_198.id;
    local_d78 = TStack_220.id;
    local_d80 = local_198.id;
    local_d88 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_198,TStack_220,local_198,TStack_220);
    local_d90 = local_1a8.id;
    local_d98 = local_1a8.id;
    local_da0 = local_1a8.id;
    local_da8 = local_1a8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1a8,local_1a8,local_1a8,local_1a8);
    local_db0 = local_1a8.id;
    local_db8 = local_1b8.id;
    local_dc0 = local_1a8.id;
    local_dc8 = local_1b8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1a8,local_1b8,local_1a8,local_1b8);
    local_dd0 = local_1a8.id;
    local_dd8 = local_1c8.id;
    local_de0 = local_1a8.id;
    local_de8 = local_1c8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1a8,local_1c8,local_1a8,local_1c8);
    local_df0 = local_1a8.id;
    local_df8 = local_1d8.id;
    local_e00 = local_1a8.id;
    local_e08 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1a8,local_1d8,local_1a8,local_1d8);
    local_e10 = local_1a8.id;
    local_e18 = local_1e8.id;
    local_e20 = local_1a8.id;
    local_e28 = local_1e8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1a8,local_1e8,local_1a8,local_1e8);
    local_e30.id = local_1a8.id;
    local_e38.id = local_1f8.id;
    ::wasm::Type::Type(&local_e40,none);
    local_e48 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_e30,local_e38,local_e40,TStack_220);
    local_e50.id = local_1a8.id;
    local_e58.id = local_208.id;
    ::wasm::Type::Type(&local_e60,none);
    local_e68 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_e50,local_e58,local_e60,TStack_220);
    local_e70.id = local_1a8.id;
    local_e78.id = unreachable.id;
    ::wasm::Type::Type(&local_e80,none);
    local_e88 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_e70,local_e78,local_e80,TStack_220);
    local_e90 = local_1a8.id;
    local_e98 = TStack_220.id;
    local_ea0 = local_1a8.id;
    local_ea8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1a8,TStack_220,local_1a8,TStack_220);
    local_eb0 = local_1b8.id;
    local_eb8 = local_1b8.id;
    local_ec0 = local_1b8.id;
    local_ec8 = local_1b8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1b8,local_1b8,local_1b8,local_1b8);
    local_ed0 = local_1b8.id;
    local_ed8 = local_1c8.id;
    local_ee0 = local_1c8.id;
    local_ee8 = local_1b8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1b8,local_1c8,local_1c8,local_1b8);
    local_ef0 = local_1b8.id;
    local_ef8 = local_1d8.id;
    local_f00 = local_1b8.id;
    local_f08 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1b8,local_1d8,local_1b8,local_1d8);
    local_f10 = local_1b8.id;
    local_f18 = local_1e8.id;
    local_f20 = local_1c8.id;
    local_f28 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1b8,local_1e8,local_1c8,local_1d8);
    local_f30.id = local_1b8.id;
    local_f38.id = local_1f8.id;
    ::wasm::Type::Type(&local_f40,none);
    local_f48 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_f30,local_f38,local_f40,TStack_220);
    local_f50.id = local_1b8.id;
    local_f58.id = local_208.id;
    ::wasm::Type::Type(&local_f60,none);
    local_f68 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_f50,local_f58,local_f60,TStack_220);
    local_f70.id = local_1b8.id;
    local_f78.id = unreachable.id;
    ::wasm::Type::Type(&local_f80,none);
    local_f88 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_f70,local_f78,local_f80,TStack_220);
    local_f90 = local_1b8.id;
    local_f98 = TStack_220.id;
    local_fa0 = local_1b8.id;
    local_fa8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1b8,TStack_220,local_1b8,TStack_220);
    local_fb0 = local_1c8.id;
    local_fb8 = local_1c8.id;
    local_fc0 = local_1c8.id;
    local_fc8 = local_1c8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1c8,local_1c8,local_1c8,local_1c8);
    local_fd0 = local_1c8.id;
    local_fd8 = local_1d8.id;
    local_fe0 = local_1c8.id;
    local_fe8 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1c8,local_1d8,local_1c8,local_1d8);
    local_ff0 = local_1c8.id;
    local_ff8 = local_1e8.id;
    local_1000 = local_1c8.id;
    local_1008 = local_1e8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1c8,local_1e8,local_1c8,local_1e8);
    local_1010.id = local_1c8.id;
    local_1018.id = local_1f8.id;
    ::wasm::Type::Type(&local_1020,none);
    local_1028 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1010,local_1018,local_1020,TStack_220);
    local_1030.id = local_1c8.id;
    local_1038.id = local_208.id;
    ::wasm::Type::Type(&local_1040,none);
    local_1048 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1030,local_1038,local_1040,TStack_220);
    local_1050.id = local_1c8.id;
    local_1058.id = unreachable.id;
    ::wasm::Type::Type(&local_1060,none);
    local_1068 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1050,local_1058,local_1060,TStack_220);
    local_1070 = local_1c8.id;
    local_1078 = TStack_220.id;
    local_1080 = local_1c8.id;
    local_1088 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1c8,TStack_220,local_1c8,TStack_220);
    local_1090 = local_1d8.id;
    local_1098 = local_1d8.id;
    local_10a0 = local_1d8.id;
    local_10a8 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1d8,local_1d8,local_1d8,local_1d8);
    local_10b0 = local_1d8.id;
    local_10b8 = local_1e8.id;
    local_10c0 = local_1e8.id;
    local_10c8 = local_1d8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1d8,local_1e8,local_1e8,local_1d8);
    local_10d0.id = local_1d8.id;
    local_10d8.id = local_1f8.id;
    ::wasm::Type::Type(&local_10e0,none);
    local_10e8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_10d0,local_10d8,local_10e0,TStack_220);
    local_10f0.id = local_1d8.id;
    local_10f8.id = local_208.id;
    ::wasm::Type::Type(&local_1100,none);
    local_1108 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_10f0,local_10f8,local_1100,TStack_220);
    local_1110.id = local_1d8.id;
    local_1118.id = unreachable.id;
    ::wasm::Type::Type(&local_1120,none);
    local_1128 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1110,local_1118,local_1120,TStack_220);
    local_1130 = local_1d8.id;
    local_1138 = TStack_220.id;
    local_1140 = local_1d8.id;
    local_1148 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1d8,TStack_220,local_1d8,TStack_220);
    local_1150 = local_1e8.id;
    local_1158 = local_1e8.id;
    local_1160 = local_1e8.id;
    local_1168 = local_1e8.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1e8,local_1e8,local_1e8,local_1e8);
    local_1170.id = local_1e8.id;
    local_1178.id = local_1f8.id;
    ::wasm::Type::Type(&local_1180,none);
    local_1188 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1170,local_1178,local_1180,TStack_220);
    local_1190.id = local_1e8.id;
    local_1198.id = local_208.id;
    ::wasm::Type::Type(&local_11a0,none);
    local_11a8 = TStack_220.id;
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1190,local_1198,local_11a0,TStack_220);
    local_11b0.id = local_1e8.id;
    local_11b8.id = unreachable.id;
    ::wasm::Type::Type(&local_11c0,none);
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_11b0,local_11b8,local_11c0,TStack_220);
    TestBody::anon_class_1_0_00000001::operator()
              (&local_221,local_1e8,TStack_220,local_1e8,TStack_220);
  }
  return;
}

Assistant:

TEST_F(TypeTest, TestTypeRelations) {
  HeapType definedSuper, definedSub;
  {
    TypeBuilder builder(2);
    builder[0].setOpen() = Struct();
    builder[1] = Struct();
    builder[1].subTypeOf(builder[0]);
    auto built = builder.build();
    ASSERT_TRUE(built);
    definedSuper = (*built)[0];
    definedSub = (*built)[1];
  }

  Type any = Type(HeapType::any, NonNullable, Inexact);
  Type nullAny = Type(HeapType::any, Nullable, Inexact);

  Type sup = Type(definedSuper, NonNullable, Inexact);
  Type nullSup = Type(definedSuper, Nullable, Inexact);
  Type exactSup = Type(definedSuper, NonNullable, Exact);
  Type nullExactSup = Type(definedSuper, Nullable, Exact);

  Type sub = Type(definedSub, NonNullable, Inexact);
  Type nullSub = Type(definedSub, Nullable, Inexact);
  Type exactSub = Type(definedSub, NonNullable, Exact);
  Type nullExactSub = Type(definedSub, Nullable, Exact);

  Type none = Type(HeapType::none, NonNullable, Inexact);
  Type nullNone = Type(HeapType::none, Nullable, Inexact);

  Type func = Type(HeapType::func, NonNullable, Inexact);
  Type nullFunc = Type(HeapType::func, Nullable, Inexact);

  Type i32 = Type::i32;
  Type unreachable = Type::unreachable;

  auto assertLUB = [](Type a, Type b, Type lub, Type glb) {
    auto lub1 = Type::getLeastUpperBound(a, b);
    auto lub2 = Type::getLeastUpperBound(b, a);
    EXPECT_EQ(lub, lub1);
    EXPECT_EQ(lub1, lub2);
    if (lub != Type::none) {
      EXPECT_TRUE(Type::isSubType(a, lub));
      EXPECT_TRUE(Type::isSubType(b, lub));
    }
    auto glb1 = Type::getGreatestLowerBound(a, b);
    auto glb2 = Type::getGreatestLowerBound(b, a);
    EXPECT_EQ(glb, glb1);
    EXPECT_EQ(glb, glb2);
    EXPECT_TRUE(Type::isSubType(glb, a));
    EXPECT_TRUE(Type::isSubType(glb, b));
    if (a == b) {
      EXPECT_TRUE(Type::isSubType(a, b));
      EXPECT_TRUE(Type::isSubType(b, a));
      EXPECT_EQ(lub, a);
      EXPECT_EQ(glb, a);
    } else if (lub == b) {
      EXPECT_TRUE(Type::isSubType(a, b));
      EXPECT_FALSE(Type::isSubType(b, a));
      EXPECT_EQ(glb, a);
    } else if (lub == a) {
      EXPECT_FALSE(Type::isSubType(a, b));
      EXPECT_TRUE(Type::isSubType(b, a));
      EXPECT_EQ(glb, b);
    } else if (lub != Type::none) {
      EXPECT_FALSE(Type::isSubType(a, b));
      EXPECT_FALSE(Type::isSubType(b, a));
      EXPECT_NE(glb, a);
      EXPECT_NE(glb, b);
    } else {
      EXPECT_FALSE(Type::isSubType(a, b));
      EXPECT_FALSE(Type::isSubType(b, a));
    }

    if (a.isRef() && b.isRef()) {
      auto htA = a.getHeapType();
      auto htB = b.getHeapType();

      if (lub == Type::none) {
        EXPECT_NE(htA.getTop(), htB.getTop());
        EXPECT_NE(htA.getBottom(), htB.getBottom());
      } else {
        EXPECT_EQ(htA.getTop(), htB.getTop());
        EXPECT_EQ(htA.getBottom(), htB.getBottom());
      }
    }
  };

  assertLUB(any, any, any, any);
  assertLUB(any, nullAny, nullAny, any);
  assertLUB(any, sup, any, sup);
  assertLUB(any, nullSup, nullAny, sup);
  assertLUB(any, exactSup, any, exactSup);
  assertLUB(any, nullExactSup, nullAny, exactSup);
  assertLUB(any, sub, any, sub);
  assertLUB(any, nullSub, nullAny, sub);
  assertLUB(any, exactSub, any, exactSub);
  assertLUB(any, nullExactSub, nullAny, exactSub);
  assertLUB(any, none, any, none);
  assertLUB(any, nullNone, nullAny, none);
  assertLUB(any, func, Type(Type::none), unreachable);
  assertLUB(any, nullFunc, Type(Type::none), unreachable);
  assertLUB(any, i32, Type(Type::none), unreachable);
  assertLUB(any, unreachable, any, unreachable);

  assertLUB(nullAny, nullAny, nullAny, nullAny);
  assertLUB(nullAny, sup, nullAny, sup);
  assertLUB(nullAny, nullSup, nullAny, nullSup);
  assertLUB(nullAny, exactSup, nullAny, exactSup);
  assertLUB(nullAny, nullExactSup, nullAny, nullExactSup);
  assertLUB(nullAny, sub, nullAny, sub);
  assertLUB(nullAny, nullSub, nullAny, nullSub);
  assertLUB(nullAny, exactSub, nullAny, exactSub);
  assertLUB(nullAny, nullExactSub, nullAny, nullExactSub);
  assertLUB(nullAny, none, nullAny, none);
  assertLUB(nullAny, nullNone, nullAny, nullNone);
  assertLUB(nullAny, func, Type(Type::none), unreachable);
  assertLUB(nullAny, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullAny, i32, Type(Type::none), unreachable);
  assertLUB(nullAny, unreachable, nullAny, unreachable);

  assertLUB(sup, sup, sup, sup);
  assertLUB(sup, nullSup, nullSup, sup);
  assertLUB(sup, exactSup, sup, exactSup);
  assertLUB(sup, nullExactSup, nullSup, exactSup);
  assertLUB(sup, sub, sup, sub);
  assertLUB(sup, nullSub, nullSup, sub);
  assertLUB(sup, exactSub, sup, exactSub);
  assertLUB(sup, nullExactSub, nullSup, exactSub);
  assertLUB(sup, none, sup, none);
  assertLUB(sup, nullNone, nullSup, none);
  assertLUB(sup, func, Type(Type::none), unreachable);
  assertLUB(sup, nullFunc, Type(Type::none), unreachable);
  assertLUB(sup, i32, Type(Type::none), unreachable);
  assertLUB(sup, unreachable, sup, unreachable);

  assertLUB(nullSup, nullSup, nullSup, nullSup);
  assertLUB(nullSup, exactSup, nullSup, exactSup);
  assertLUB(nullSup, nullExactSup, nullSup, nullExactSup);
  assertLUB(nullSup, sub, nullSup, sub);
  assertLUB(nullSup, nullSub, nullSup, nullSub);
  assertLUB(nullSup, exactSub, nullSup, exactSub);
  assertLUB(nullSup, nullExactSub, nullSup, nullExactSub);
  assertLUB(nullSup, none, nullSup, none);
  assertLUB(nullSup, nullNone, nullSup, nullNone);
  assertLUB(nullSup, func, Type(Type::none), unreachable);
  assertLUB(nullSup, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullSup, i32, Type(Type::none), unreachable);
  assertLUB(nullSup, unreachable, nullSup, unreachable);

  assertLUB(exactSup, exactSup, exactSup, exactSup);
  assertLUB(exactSup, nullExactSup, nullExactSup, exactSup);
  assertLUB(exactSup, sub, sup, none);
  assertLUB(exactSup, nullSub, nullSup, none);
  assertLUB(exactSup, exactSub, sup, none);
  assertLUB(exactSup, nullExactSub, nullSup, none);
  assertLUB(exactSup, none, exactSup, none);
  assertLUB(exactSup, nullNone, nullExactSup, none);
  assertLUB(exactSup, func, Type(Type::none), unreachable);
  assertLUB(exactSup, nullFunc, Type(Type::none), unreachable);
  assertLUB(exactSup, i32, Type(Type::none), unreachable);
  assertLUB(exactSup, unreachable, exactSup, unreachable);

  assertLUB(nullExactSup, nullExactSup, nullExactSup, nullExactSup);
  assertLUB(nullExactSup, sub, nullSup, none);
  assertLUB(nullExactSup, nullSub, nullSup, nullNone);
  assertLUB(nullExactSup, exactSub, nullSup, none);
  assertLUB(nullExactSup, nullExactSub, nullSup, nullNone);
  assertLUB(nullExactSup, none, nullExactSup, none);
  assertLUB(nullExactSup, nullNone, nullExactSup, nullNone);
  assertLUB(nullExactSup, func, Type(Type::none), unreachable);
  assertLUB(nullExactSup, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullExactSup, i32, Type(Type::none), unreachable);
  assertLUB(nullExactSup, unreachable, nullExactSup, unreachable);

  assertLUB(sub, sub, sub, sub);
  assertLUB(sub, nullSub, nullSub, sub);
  assertLUB(sub, exactSub, sub, exactSub);
  assertLUB(sub, nullExactSub, nullSub, exactSub);
  assertLUB(sub, none, sub, none);
  assertLUB(sub, nullNone, nullSub, none);
  assertLUB(sub, func, Type(Type::none), unreachable);
  assertLUB(sub, nullFunc, Type(Type::none), unreachable);
  assertLUB(sub, i32, Type(Type::none), unreachable);
  assertLUB(sub, unreachable, sub, unreachable);

  assertLUB(nullSub, nullSub, nullSub, nullSub);
  assertLUB(nullSub, exactSub, nullSub, exactSub);
  assertLUB(nullSub, nullExactSub, nullSub, nullExactSub);
  assertLUB(nullSub, none, nullSub, none);
  assertLUB(nullSub, nullNone, nullSub, nullNone);
  assertLUB(nullSub, func, Type(Type::none), unreachable);
  assertLUB(nullSub, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullSub, i32, Type(Type::none), unreachable);
  assertLUB(nullSub, unreachable, nullSub, unreachable);

  assertLUB(exactSub, exactSub, exactSub, exactSub);
  assertLUB(exactSub, nullExactSub, nullExactSub, exactSub);
  assertLUB(exactSub, none, exactSub, none);
  assertLUB(exactSub, nullNone, nullExactSub, none);
  assertLUB(exactSub, func, Type(Type::none), unreachable);
  assertLUB(exactSub, nullFunc, Type(Type::none), unreachable);
  assertLUB(exactSub, i32, Type(Type::none), unreachable);
  assertLUB(exactSub, unreachable, exactSub, unreachable);

  assertLUB(nullExactSub, nullExactSub, nullExactSub, nullExactSub);
  assertLUB(nullExactSub, none, nullExactSub, none);
  assertLUB(nullExactSub, nullNone, nullExactSub, nullNone);
  assertLUB(nullExactSub, func, Type(Type::none), unreachable);
  assertLUB(nullExactSub, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullExactSub, i32, Type(Type::none), unreachable);
  assertLUB(nullExactSub, unreachable, nullExactSub, unreachable);

  assertLUB(none, none, none, none);
  assertLUB(none, nullNone, nullNone, none);
  assertLUB(none, func, Type(Type::none), unreachable);
  assertLUB(none, nullFunc, Type(Type::none), unreachable);
  assertLUB(none, i32, Type(Type::none), unreachable);
  assertLUB(none, unreachable, none, unreachable);

  assertLUB(nullNone, nullNone, nullNone, nullNone);
  assertLUB(nullNone, func, Type(Type::none), unreachable);
  assertLUB(nullNone, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullNone, i32, Type(Type::none), unreachable);
  assertLUB(nullNone, unreachable, nullNone, unreachable);
}